

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O3

void lj_cconv_ct_init(CTState *cts,CType *d,CTSize sz,uint8_t *dp,TValue *o,MSize len)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t __n;
  uint uVar4;
  ulong uVar5;
  CType *d_00;
  ulong uVar6;
  MSize local_34;
  
  uVar6 = (ulong)len;
  __n = (size_t)sz;
  if (len == 1) {
    iVar2 = lj_cconv_multi_init(cts,d,o);
    if (iVar2 == 0) {
      lj_cconv_ct_tv(cts,d,dp,o,0);
      return;
    }
  }
  else if (len == 0) goto LAB_0013808b;
  uVar3 = d->info >> 0x1c;
  if (uVar3 == 1) {
    local_34 = 0;
    memset(dp,0,__n);
    cconv_substruct_init(cts,d,dp,o,len,&local_34);
    if (len <= local_34) {
      return;
    }
    cconv_err_initov(cts,d);
  }
  if (uVar3 == 3) {
    d_00 = (CType *)((long)&cts->tab->info + (ulong)((d->info & 0xffff) << 4));
    uVar3 = d_00->size;
    if (uVar3 * len <= sz) {
      if (len == 0) {
        uVar4 = 0;
      }
      else {
        uVar5 = 0;
        do {
          lj_cconv_ct_tv(cts,d_00,dp + uVar5,o,0);
          uVar4 = (int)uVar5 + uVar3;
          uVar5 = (ulong)uVar4;
          o = o + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      uVar1 = uVar3;
      if (uVar4 == uVar3) {
        for (; uVar1 < sz; uVar1 = uVar1 + uVar3) {
          memcpy(dp + uVar1,dp,(ulong)uVar3);
        }
        return;
      }
      dp = dp + uVar4;
      __n = (size_t)(sz - uVar4);
LAB_0013808b:
      memset(dp,0,__n);
      return;
    }
  }
  cconv_err_initov(cts,d);
}

Assistant:

void lj_cconv_ct_init(CTState *cts, CType *d, CTSize sz,
		      uint8_t *dp, TValue *o, MSize len)
{
  if (len == 0)
    memset(dp, 0, sz);
  else if (len == 1 && !lj_cconv_multi_init(cts, d, o))
    lj_cconv_ct_tv(cts, d, dp, o, 0);
  else if (ctype_isarray(d->info))  /* Also handles valarray init with len>1. */
    cconv_array_init(cts, d, sz, dp, o, len);
  else if (ctype_isstruct(d->info))
    cconv_struct_init(cts, d, sz, dp, o, len);
  else
    cconv_err_initov(cts, d);
}